

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::InlineGreedyStringParserUTF8Verify
                 (string *s,char *ptr,ParseContext *ctx,char *field_name)

{
  StringPiece str;
  char *pcVar1;
  char *in_stack_00000008;
  char *p;
  ParseContext *in_stack_ffffffffffffffc8;
  StringPiece *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  
  pcVar1 = InlineGreedyStringParser
                     (in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
                      in_stack_ffffffffffffffc8);
  StringPiece::StringPiece<std::allocator<char>>
            (in_stack_ffffffffffffffd0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffc8);
  str.length_ = (stringpiece_ssize_type)field_name;
  str.ptr_ = p;
  VerifyUTF8(str,in_stack_00000008);
  return pcVar1;
}

Assistant:

inline PROTOBUF_MUST_USE_RESULT const char* InlineGreedyStringParserUTF8Verify(
    std::string* s, const char* ptr, ParseContext* ctx,
    const char* field_name) {
  auto p = InlineGreedyStringParser(s, ptr, ctx);
#ifndef NDEBUG
  VerifyUTF8(*s, field_name);
#else   // !NDEBUG
  (void)field_name;
#endif  // !NDEBUG
  return p;
}